

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O0

string * __thiscall
util::make_string<std::__cxx11::string&,char_const(&)[24]>
          (string *__return_storage_ptr__,util *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
          char (*args_1) [24])

{
  ostringstream local_198 [8];
  ostringstream ss;
  char (*args_local_1) [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local;
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  std::operator<<((ostream *)local_198,(string *)this);
  std::operator<<((ostream *)local_198,(char *)args);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return __return_storage_ptr__;
}

Assistant:

std::string make_string(Args&& ... args)
{
    std::ostringstream ss;
    (void)std::initializer_list<bool> {(ss << args, false)...};
    return ss.str();
}